

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmsockets.c
# Opt level: O1

attr_list libcmsockets_LTX_non_blocking_listen
                    (CManager cm,CMtrans_services_conflict svc,transport_entry_conflict trans,
                    attr_list listen_info)

{
  uint uVar1;
  undefined8 *puVar2;
  atom_t aVar3;
  ushort uVar4;
  int iVar5;
  uint __fd;
  __pid_t _Var6;
  int iVar7;
  int iVar8;
  time_t tVar9;
  void *pvVar10;
  attr_list p_Var11;
  char *pcVar12;
  undefined8 uVar13;
  long lVar14;
  uint uVar15;
  CMtrans_services_conflict pCVar16;
  int iVar17;
  ulong uVar18;
  int use_hostname;
  int port_range_high;
  int port_range_low;
  int attr_port_num;
  CMtrans_services_conflict local_170;
  sockaddr_in sock_addr;
  int IP;
  int sock_opt_val;
  CManager local_150;
  uint length;
  transport_entry_conflict local_140;
  char host_name [256];
  
  puVar2 = (undefined8 *)trans->trans_data;
  sock_opt_val = 1;
  attr_port_num = 0;
  use_hostname = 0;
  if (((CManager)*puVar2 != (CManager)0x0) &&
     (iVar5 = (*svc->return_CM_lock_status)
                        ((CManager)*puVar2,
                         "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmsockets.c"
                         ,0x29e), iVar5 == 0)) {
    __assert_fail("CM_LOCKED(svc, sd->cm)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmsockets.c"
                  ,0x29e,
                  "attr_list libcmsockets_LTX_non_blocking_listen(CManager, CMtrans_services, transport_entry, attr_list)"
                 );
  }
  local_170 = svc;
  local_140 = trans;
  if (listen_info == (attr_list)0x0) {
LAB_001030fc:
    uVar15 = attr_port_num;
    if (0xffff < (uint)attr_port_num) {
      fprintf(_stderr,"Requested port number %d is invalid\n",(ulong)(uint)attr_port_num);
      return (attr_list)0x0;
    }
  }
  else {
    iVar5 = query_attr(listen_info,CM_IP_PORT,0,&attr_port_num);
    uVar15 = 0;
    if (iVar5 != 0) goto LAB_001030fc;
  }
  pCVar16 = local_170;
  __fd = 0;
  (*local_170->trace_out)(cm,"CMSocket begin listen, requested port %d",(ulong)(uint)attr_port_num);
  get_IP_config(host_name,0x100,&IP,&port_range_low,&port_range_high,&use_hostname,listen_info,
                pCVar16->trace_out,cm);
  sock_addr.sin_family = 2;
  sock_addr.sin_port = (ushort)uVar15 << 8 | (ushort)uVar15 >> 8;
  sock_addr.sin_addr.s_addr = 0;
  if (0 < (long)*(int *)(puVar2 + 2)) {
    lVar14 = 0;
    __fd = 0;
    do {
      uVar1 = *(uint *)(puVar2[4] + lVar14 * 4);
      if ((uVar1 == (uVar15 & 0xffff)) ||
         ((port_range_low <= (int)uVar1 && ((int)uVar1 <= port_range_high)))) {
        __fd = *(uint *)(puVar2[3] + lVar14 * 4);
      }
      lVar14 = lVar14 + 1;
    } while (*(int *)(puVar2 + 2) != lVar14);
  }
  if (__fd == 0) {
    __fd = socket(2,1,0);
    pCVar16 = local_170;
    if (__fd == 0xffffffff) {
      libcmsockets_LTX_non_blocking_listen_cold_9();
      return (attr_list)0x0;
    }
    if (sock_addr.sin_port == 0) {
      local_150 = cm;
      if (port_range_high == -1) {
        sock_addr.sin_port = 0;
        (*local_170->trace_out)(cm,"CMSocket trying to bind to any available port");
        iVar5 = bind(__fd,(sockaddr *)&sock_addr,0x10);
        if (iVar5 == -1) {
          libcmsockets_LTX_non_blocking_listen_cold_8();
          return (attr_list)0x0;
        }
      }
      else {
        tVar9 = time((time_t *)0x0);
        _Var6 = getpid();
        iVar5 = port_range_high - port_range_low;
        srand((int)tVar9 + _Var6);
        iVar17 = 0x1e;
        pCVar16 = local_170;
        do {
          iVar8 = port_range_low;
          iVar7 = rand();
          uVar4 = (short)(iVar7 % iVar5) + (short)iVar8;
          sock_addr.sin_port = uVar4 * 0x100 | uVar4 >> 8;
          (*pCVar16->trace_out)(local_150,"CMSocket trying to bind port %d");
          iVar8 = bind(__fd,(sockaddr *)&sock_addr,0x10);
          if (iVar8 == -1) {
            iVar17 = iVar17 + -1;
          }
          else {
            iVar17 = 0;
          }
          if (iVar17 * -0x33333333 + 0xccccccccU < 0x33333333) {
            tVar9 = time((time_t *)0x0);
            _Var6 = getpid();
            pCVar16 = local_170;
            srand((int)tVar9 + _Var6);
          }
          if (iVar17 == 0x14) {
            iVar5 = iVar5 * 10;
          }
          iVar7 = iVar5 * 10;
          if (iVar17 != 10) {
            iVar7 = iVar5;
          }
          iVar5 = iVar7;
        } while (0 < iVar17);
        cm = local_150;
        if (iVar8 == -1) {
          libcmsockets_LTX_non_blocking_listen_cold_5();
          return (attr_list)0x0;
        }
      }
    }
    else {
      iVar5 = setsockopt(__fd,1,2,&sock_opt_val,4);
      if (iVar5 != 0) {
        libcmsockets_LTX_non_blocking_listen_cold_2();
        return (attr_list)0x0;
      }
      sock_opt_val = 1;
      iVar5 = setsockopt(__fd,1,0xf,&sock_opt_val,4);
      pCVar16 = local_170;
      if (iVar5 != 0) {
        libcmsockets_LTX_non_blocking_listen_cold_3();
        return (attr_list)0x0;
      }
      (*local_170->trace_out)
                (cm,"CMSocket trying to bind selected port %d",(ulong)(uVar15 & 0xffff));
      iVar5 = bind(__fd,(sockaddr *)&sock_addr,0x10);
      if (iVar5 == -1) {
        libcmsockets_LTX_non_blocking_listen_cold_4();
        return (attr_list)0x0;
      }
    }
    iVar5 = listen(__fd,0x400);
    if (iVar5 != 0) {
      libcmsockets_LTX_non_blocking_listen_cold_6();
      return (attr_list)0x0;
    }
    (*pCVar16->trace_out)(cm,"CMSockets Adding socket_accept_conn as action on fd %d",(ulong)__fd);
    (*pCVar16->fd_add_select)(cm,__fd,socket_accept_conn,local_140,(void *)(long)(int)__fd);
    length = 0x10;
    iVar5 = getsockname(__fd,(sockaddr *)&sock_addr,&length);
    if (iVar5 < 0) {
      libcmsockets_LTX_non_blocking_listen_cold_7();
      return (attr_list)0x0;
    }
    pvVar10 = realloc((void *)puVar2[3],(long)*(int *)(puVar2 + 2) * 4 + 4);
    puVar2[3] = pvVar10;
    pvVar10 = realloc((void *)puVar2[4],(long)*(int *)(puVar2 + 2) * 4 + 4);
    puVar2[4] = pvVar10;
    *(uint *)(puVar2[3] + (long)*(int *)(puVar2 + 2) * 4) = __fd;
    *(uint *)((long)pvVar10 + (long)*(int *)(puVar2 + 2) * 4) =
         (uint)(ushort)(sock_addr.sin_port << 8 | sock_addr.sin_port >> 8);
    *(int *)(puVar2 + 2) = *(int *)(puVar2 + 2) + 1;
  }
  else {
    length = 0x10;
    iVar5 = getsockname(__fd,(sockaddr *)&sock_addr,&length);
    pCVar16 = local_170;
    if (iVar5 < 0) {
      libcmsockets_LTX_non_blocking_listen_cold_1();
      return (attr_list)0x0;
    }
    (*local_170->trace_out)
              (cm,"CMSockets reusing prior listen, fd %d, port %d\n",(ulong)__fd,
               (ulong)(ushort)(sock_addr.sin_port << 8 | sock_addr.sin_port >> 8));
  }
  uVar18 = (ulong)(ushort)(sock_addr.sin_port << 8 | sock_addr.sin_port >> 8);
  (*pCVar16->trace_out)(cm,"CMSocket listen succeeded on port %d, fd %d",uVar18,(ulong)__fd);
  p_Var11 = (attr_list)create_attr_list();
  if ((void *)puVar2[1] != (void *)0x0) {
    (*pCVar16->free_func)((void *)puVar2[1]);
  }
  pcVar12 = strdup(host_name);
  puVar2[1] = pcVar12;
  if ((IP != 0) && (use_hostname == 0)) {
    add_attr(p_Var11,CM_IP_ADDR,1);
  }
  pcVar12 = getenv("CMSocketsUseHostname");
  aVar3 = CM_IP_HOSTNAME;
  if ((pcVar12 == (char *)0x0) && (use_hostname == 0)) {
    if (IP != 0) goto LAB_00103570;
    pcVar12 = (char *)0x7f000001;
    uVar13 = 1;
    aVar3 = CM_IP_ADDR;
  }
  else {
    pcVar12 = strdup(host_name);
    uVar13 = 3;
  }
  add_attr(p_Var11,aVar3,uVar13,pcVar12);
LAB_00103570:
  add_attr(p_Var11,CM_IP_PORT,1,uVar18);
  return p_Var11;
}

Assistant:

extern attr_list
libcmsockets_LTX_non_blocking_listen(CManager cm, CMtrans_services svc, transport_entry trans, attr_list listen_info)
{
    socket_client_data_ptr sd = trans->trans_data;
    unsigned int length;
    struct sockaddr_in sock_addr;
    int sock_opt_val = 1;
    SOCKET conn_sock = 0;
    int attr_port_num = 0;
    u_short port_num = 0;
    int port_range_low, port_range_high;
    int use_hostname = 0;
    int IP;
    char host_name[256];

    if (sd->cm) {
	/* assert CM is locked */
	assert(CM_LOCKED(svc, sd->cm));
    }
    /* 
     *  Check to see if a bind to a specific port was requested
     */
    if (listen_info != NULL
	&& !query_attr(listen_info, CM_IP_PORT,
		       NULL, (attr_value *)(intptr_t) & attr_port_num)) {
	port_num = 0;
    } else {
	if (attr_port_num > USHRT_MAX || attr_port_num < 0) {
	    fprintf(stderr, "Requested port number %d is invalid\n", attr_port_num);
	    return NULL;
	}
	port_num = attr_port_num;
    }

    svc->trace_out(cm, "CMSocket begin listen, requested port %d", attr_port_num);
    get_IP_config(host_name, sizeof(host_name), &IP, &port_range_low, &port_range_high, 
		  &use_hostname, listen_info, svc->trace_out, (void *)cm);

    sock_addr.sin_family = AF_INET;
    sock_addr.sin_addr.s_addr = INADDR_ANY;
    sock_addr.sin_port = htons(port_num);

    for (int i = 0; i < sd->listen_count; i++) {
	if ((sd->listen_ports[i] == port_num) ||
	    ((sd->listen_ports[i] >= port_range_low) &&
	     (sd->listen_ports[i] <= port_range_high))) {
	    conn_sock = sd->listen_fds[i];
	}
    }
    if (!conn_sock) {
	conn_sock = socket(AF_INET, SOCK_STREAM, 0);
	if (conn_sock == SOCKET_ERROR) {
	    fprintf(stderr, "Cannot open INET socket\n");
	    return NULL;
	}
	if (sock_addr.sin_port != 0) {
	    /* specific port requested. set REUSEADDR, REUSEPORT because previous server might have died badly */
	    if (setsockopt(conn_sock, SOL_SOCKET, SO_REUSEADDR, (char *) &sock_opt_val,
			   sizeof(sock_opt_val)) != 0) {
		fprintf(stderr, "Failed to set REUSEADDR on INET socket before bind\n");
		perror("setsockopt(SO_REUSEADDR) failed");
		return NULL;
	    }
#ifdef SO_REUSEPORT
	    sock_opt_val = 1;
	    if (setsockopt(conn_sock, SOL_SOCKET, SO_REUSEPORT, (const char*)&sock_opt_val, sizeof(sock_opt_val)) != 0) {
		fprintf(stderr, "Failed to set REUSEADDR on INET socket before bind\n");
		perror("setsockopt(SO_REUSEPORT) failed");
		return NULL;
	    }
#endif
	    svc->trace_out(cm, "CMSocket trying to bind selected port %d", port_num);
	    if (bind(conn_sock, (struct sockaddr *) &sock_addr,
		     sizeof sock_addr) == SOCKET_ERROR) {
		fprintf(stderr, "Cannot bind INET socket\n");
		return NULL;
	    }
	} else if (port_range_high == -1) {
	    /* bind to any port, range unconstrained */
	    sock_addr.sin_port = 0;
	    svc->trace_out(cm, "CMSocket trying to bind to any available port");
	    if (bind(conn_sock, (struct sockaddr *) &sock_addr,
		     sizeof sock_addr) == SOCKET_ERROR) {
		fprintf(stderr, "Cannot bind INET socket\n");
		return NULL;
	    }
	} else {
	    long seedval = (long) time(NULL) + getpid();
	    /* port num is free.  Constrain to range to standards */
	    int size = port_range_high - port_range_low;
	    int tries = 30;
	    int result = SOCKET_ERROR;
	    srand(seedval);
	    while (tries > 0) {
		int target = port_range_low + (rand() % size);
		sock_addr.sin_port = htons(target);
		svc->trace_out(cm, "CMSocket trying to bind port %d", target);
		result = bind(conn_sock, (struct sockaddr *) &sock_addr,
			      sizeof sock_addr);
		tries--;
		if (result != SOCKET_ERROR) tries = 0;
		if (tries%5 == 4) {
		    /* try reseeding in case we're in sync with another process */
		    srand((int)time(NULL) + (int)getpid());
		}
		if (tries == 20) {
		    /* damn, tried a lot, increase the range (This might violate specified range) */
		    size *= 10;
		}
		if (tries == 10) {
		    /* damn, tried a lot more, increase the range (This might violate specified range) */
		    size *= 10;
		}
	    }
	    if (result == SOCKET_ERROR) {
		fprintf(stderr, "Cannot bind INET socket\n");
		return NULL;
	    }
	}
	/* begin listening for conns and set the backlog */
	if (listen(conn_sock, FD_SETSIZE)) {
	    fprintf(stderr, "listen failed\n");
	    return NULL;
	}
	svc->trace_out(cm, "CMSockets Adding socket_accept_conn as action on fd %d", conn_sock);
	svc->fd_add_select(cm, conn_sock, (select_list_func)socket_accept_conn,
			   (void *) trans, (void *) (intptr_t)conn_sock);

	length = sizeof(sock_addr);
	if (getsockname(conn_sock, (struct sockaddr *) &sock_addr, &length) < 0) {
	    fprintf(stderr, "Cannot get socket name\n");
	    return NULL;
	}
	sd->listen_fds = realloc(sd->listen_fds,
				 sizeof(SOCKET)*(sd->listen_count+1));
	sd->listen_ports = realloc(sd->listen_ports,
				 sizeof(int)*(sd->listen_count+1));
	sd->listen_fds[sd->listen_count] = conn_sock;
	sd->listen_ports[sd->listen_count] = ntohs(sock_addr.sin_port);
	sd->listen_count++;
    } else {
	length = sizeof(sock_addr);
	if (getsockname(conn_sock, (struct sockaddr *) &sock_addr, &length) < 0) {
	    fprintf(stderr, "Cannot get socket name\n");
	    return NULL;
	}
	svc->trace_out(cm, "CMSockets reusing prior listen, fd %d, port %d\n", conn_sock, ntohs(sock_addr.sin_port));
    }
    /* set the port num as one we can be contacted at */
    {
	int int_port_num = ntohs(sock_addr.sin_port);
	attr_list ret_list;

	svc->trace_out(cm, "CMSocket listen succeeded on port %d, fd %d",
		       int_port_num, conn_sock);
	ret_list = create_attr_list();

	if (sd->hostname != NULL)
	    svc->free_func(sd->hostname);
	sd->hostname = strdup(host_name);
	if ((IP != 0) && (!use_hostname)) {
	    add_attr(ret_list, CM_IP_ADDR, Attr_Int4,
		     (attr_value) (intptr_t)IP);
	}
	if ((getenv("CMSocketsUseHostname") != NULL) || 
	    use_hostname) {
	    add_attr(ret_list, CM_IP_HOSTNAME, Attr_String,
		     (attr_value) strdup(host_name));
	} else if (IP == 0) {
	    add_attr(ret_list, CM_IP_ADDR, Attr_Int4, 
		     (attr_value)INADDR_LOOPBACK);
	}
	add_attr(ret_list, CM_IP_PORT, Attr_Int4,
		 (attr_value) (intptr_t)int_port_num);

	return ret_list;
    }
}